

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtScc(word *pTruth,int nVars)

{
  word wTruth;
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar1 = (char)nVars - 6U & 0x1f;
  uVar5 = 0;
  uVar4 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar4 = uVar5;
  }
  Abc_TtNormalizeSmallTruth(pTruth,nVars);
  if (nVars < 7) {
    uVar4 = 1;
  }
  iVar3 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    wTruth = pTruth[uVar5];
    iVar2 = Abc_TtBitCount16((int)uVar5);
    iVar2 = Abc_TtScc6(wTruth,iVar2);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

int Abc_TtScc(word * pTruth, int nVars)
{
    int k, nWords = Abc_TtWordNum(nVars);
    int sum = 0;
    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    for (k = 0; k < nWords; k++)
        sum += Abc_TtScc6(pTruth[k], Abc_TtBitCount16(k));
    return sum;
}